

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeDeleteRowid(Rtree *pRtree,sqlite3_int64 iDelete)

{
  RtreeNode *pRVar1;
  RtreeNode *pRVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  i64 iNode;
  uint iCell_00;
  int iCell;
  RtreeNode *pRoot;
  RtreeNode *local_70;
  RtreeNode *pInsert;
  RtreeNode *pChild;
  
  local_70 = (RtreeNode *)0x0;
  pRoot = (RtreeNode *)0x0;
  iVar4 = nodeAcquire(pRtree,1,(RtreeNode *)0x0,&pRoot);
  if (iVar4 == 0) {
    iVar4 = findLeafNode(pRtree,iDelete,&local_70,(sqlite3_int64 *)0x0);
    pRVar1 = local_70;
    if (local_70 != (RtreeNode *)0x0 && iVar4 == 0) {
      iVar5 = nodeRowidIndex(pRtree,local_70,iDelete,&iCell);
      if (iVar5 == 0) {
        iVar5 = deleteCell(pRtree,pRVar1,iCell,0);
      }
      iVar4 = nodeRelease(pRtree,pRVar1);
      if (iVar5 != 0) {
        iVar4 = iVar5;
      }
    }
    if (iVar4 == 0) {
      sqlite3_bind_int64(pRtree->pDeleteRowid,1,iDelete);
      sqlite3_step(pRtree->pDeleteRowid);
      iVar4 = sqlite3_reset(pRtree->pDeleteRowid);
      pRVar1 = pRoot;
      if (((iVar4 == 0) && (iVar4 = 0, 0 < pRtree->iDepth)) &&
         (uVar3 = *(ushort *)(pRoot->zData + 2), (ushort)(uVar3 << 8 | uVar3 >> 8) == 1)) {
        pChild = (RtreeNode *)0x0;
        iNode = readInt64(pRoot->zData + 4);
        iVar5 = nodeAcquire(pRtree,iNode,pRVar1,&pChild);
        pRVar2 = pChild;
        if (iVar5 == 0) {
          iVar5 = removeNode(pRtree,pChild,pRtree->iDepth + -1);
        }
        iVar4 = nodeRelease(pRtree,pRVar2);
        if (iVar5 != 0) {
          iVar4 = iVar5;
        }
        if (iVar4 == 0) {
          iVar5 = pRtree->iDepth + -1;
          pRtree->iDepth = iVar5;
          uVar3 = (ushort)iVar5;
          *(ushort *)pRVar1->zData = uVar3 << 8 | uVar3 >> 8;
          pRVar1->isDirty = 1;
        }
      }
    }
  }
  while (pRVar1 = pRtree->pDeleted, pRVar1 != (RtreeNode *)0x0) {
    if (iVar4 == 0) {
      uVar3 = *(ushort *)(pRVar1->zData + 2);
      iVar4 = 0;
      for (iCell_00 = 0; (iVar4 == 0 && (iCell_00 < (ushort)(uVar3 << 8 | uVar3 >> 8)));
          iCell_00 = iCell_00 + 1) {
        nodeGetCell(pRtree,pRVar1,iCell_00,(RtreeCell *)&pChild);
        iVar4 = ChooseLeaf(pRtree,(RtreeCell *)&pChild,(int)pRVar1->iNode,&pInsert);
        pRVar2 = pInsert;
        if (iVar4 == 0) {
          iVar5 = rtreeInsertCell(pRtree,pInsert,(RtreeCell *)&pChild,(int)pRVar1->iNode);
          iVar4 = nodeRelease(pRtree,pRVar2);
          if (iVar5 != 0) {
            iVar4 = iVar5;
          }
        }
      }
    }
    pRtree->pDeleted = pRVar1->pNext;
    pRtree->nNodeRef = pRtree->nNodeRef - 1;
    sqlite3_free(pRVar1);
  }
  iVar5 = nodeRelease(pRtree,pRoot);
  if (iVar4 != 0) {
    iVar5 = iVar4;
  }
  return iVar5;
}

Assistant:

static int rtreeDeleteRowid(Rtree *pRtree, sqlite3_int64 iDelete){
  int rc;                         /* Return code */
  RtreeNode *pLeaf = 0;           /* Leaf node containing record iDelete */
  int iCell;                      /* Index of iDelete cell in pLeaf */
  RtreeNode *pRoot = 0;           /* Root node of rtree structure */


  /* Obtain a reference to the root node to initialize Rtree.iDepth */
  rc = nodeAcquire(pRtree, 1, 0, &pRoot);

  /* Obtain a reference to the leaf node that contains the entry 
  ** about to be deleted. 
  */
  if( rc==SQLITE_OK ){
    rc = findLeafNode(pRtree, iDelete, &pLeaf, 0);
  }

#ifdef CORRUPT_DB
  assert( pLeaf!=0 || rc!=SQLITE_OK || CORRUPT_DB );
#endif

  /* Delete the cell in question from the leaf node. */
  if( rc==SQLITE_OK && pLeaf ){
    int rc2;
    rc = nodeRowidIndex(pRtree, pLeaf, iDelete, &iCell);
    if( rc==SQLITE_OK ){
      rc = deleteCell(pRtree, pLeaf, iCell, 0);
    }
    rc2 = nodeRelease(pRtree, pLeaf);
    if( rc==SQLITE_OK ){
      rc = rc2;
    }
  }

  /* Delete the corresponding entry in the <rtree>_rowid table. */
  if( rc==SQLITE_OK ){
    sqlite3_bind_int64(pRtree->pDeleteRowid, 1, iDelete);
    sqlite3_step(pRtree->pDeleteRowid);
    rc = sqlite3_reset(pRtree->pDeleteRowid);
  }

  /* Check if the root node now has exactly one child. If so, remove
  ** it, schedule the contents of the child for reinsertion and 
  ** reduce the tree height by one.
  **
  ** This is equivalent to copying the contents of the child into
  ** the root node (the operation that Gutman's paper says to perform 
  ** in this scenario).
  */
  if( rc==SQLITE_OK && pRtree->iDepth>0 && NCELL(pRoot)==1 ){
    int rc2;
    RtreeNode *pChild = 0;
    i64 iChild = nodeGetRowid(pRtree, pRoot, 0);
    rc = nodeAcquire(pRtree, iChild, pRoot, &pChild);
    if( rc==SQLITE_OK ){
      rc = removeNode(pRtree, pChild, pRtree->iDepth-1);
    }
    rc2 = nodeRelease(pRtree, pChild);
    if( rc==SQLITE_OK ) rc = rc2;
    if( rc==SQLITE_OK ){
      pRtree->iDepth--;
      writeInt16(pRoot->zData, pRtree->iDepth);
      pRoot->isDirty = 1;
    }
  }

  /* Re-insert the contents of any underfull nodes removed from the tree. */
  for(pLeaf=pRtree->pDeleted; pLeaf; pLeaf=pRtree->pDeleted){
    if( rc==SQLITE_OK ){
      rc = reinsertNodeContent(pRtree, pLeaf);
    }
    pRtree->pDeleted = pLeaf->pNext;
    pRtree->nNodeRef--;
    sqlite3_free(pLeaf);
  }

  /* Release the reference to the root node. */
  if( rc==SQLITE_OK ){
    rc = nodeRelease(pRtree, pRoot);
  }else{
    nodeRelease(pRtree, pRoot);
  }

  return rc;
}